

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.cpp
# Opt level: O0

void Imath_3_2::anon_unknown_20::twoSidedJacobiSVD<float>
               (Matrix44<float> *A,Matrix44<float> *U,Vec4<float> *S,Matrix44<float> *V,float tol,
               bool forcePositiveDeterminant)

{
  float fVar1;
  uint uVar2;
  bool bVar3;
  float *pfVar4;
  Matrix44<float> *in_RCX;
  Vec4<float> *in_RDX;
  Matrix44<float> *in_RSI;
  Matrix44<float> *in_RDI;
  Vec4<float> *pVVar5;
  byte in_R8B;
  float in_XMM0_Da;
  float fVar6;
  float fVar7;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  int i_3;
  int i_2;
  int k_3;
  int k_2;
  int k_1;
  int k;
  int j_1;
  float sVal;
  Vec4<float> vCol;
  Vec4<float> uCol;
  int i_1;
  int j;
  int i;
  bool changed;
  int numIter;
  float absTol;
  int maxIter;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  float in_stack_ffffffffffffff40;
  float in_stack_ffffffffffffff44;
  bool local_96;
  undefined1 local_95;
  undefined1 local_94;
  undefined1 local_93;
  undefined1 local_92;
  undefined1 local_91;
  int local_84;
  int local_80;
  int local_7c;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  Vec4<float> local_64;
  float in_stack_ffffffffffffffac;
  Matrix44<float> *in_stack_ffffffffffffffb0;
  float in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  int in_stack_ffffffffffffffc0;
  int iVar8;
  int in_stack_ffffffffffffffc4;
  int iVar9;
  uint in_stack_ffffffffffffffc8;
  undefined4 uVar10;
  uint uVar11;
  
  Matrix44<float>::makeIdentity(in_RSI);
  Matrix44<float>::makeIdentity(in_RCX);
  fVar6 = maxOffDiag<float>((Matrix44<float> *)
                            CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
  fVar6 = in_XMM0_Da * fVar6;
  if ((fVar6 != 0.0) || (NAN(fVar6))) {
    iVar9 = 0;
    do {
      iVar9 = iVar9 + 1;
      bVar3 = twoSidedJacobiRotation<float>
                        ((Matrix44<float> *)CONCAT44(iVar9,in_stack_ffffffffffffffc8),
                         in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0,
                         (Matrix44<float> *)
                         CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                         in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
      uVar10 = CONCAT13(bVar3,(int3)in_stack_ffffffffffffffc8);
      bVar3 = twoSidedJacobiRotation<float>
                        ((Matrix44<float> *)CONCAT44(iVar9,uVar10),in_stack_ffffffffffffffc4,
                         in_stack_ffffffffffffffc0,
                         (Matrix44<float> *)
                         CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                         in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
      local_91 = 1;
      if (!bVar3) {
        local_91 = (undefined1)((uint)uVar10 >> 0x18);
      }
      uVar2 = CONCAT13(local_91,(int3)uVar10);
      uVar11 = uVar2 & 0x1ffffff;
      bVar3 = twoSidedJacobiRotation<float>
                        ((Matrix44<float> *)(CONCAT44(iVar9,uVar2) & 0xffffffff01ffffff),
                         in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0,
                         (Matrix44<float> *)
                         CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                         in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
      local_92 = 1;
      if (!bVar3) {
        local_92 = (undefined1)(uVar11 >> 0x18);
      }
      uVar2 = CONCAT13(local_92,(int3)uVar11);
      uVar11 = uVar2 & 0x1ffffff;
      bVar3 = twoSidedJacobiRotation<float>
                        ((Matrix44<float> *)(CONCAT44(iVar9,uVar2) & 0xffffffff01ffffff),
                         in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0,
                         (Matrix44<float> *)
                         CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                         in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
      local_93 = 1;
      if (!bVar3) {
        local_93 = (undefined1)(uVar11 >> 0x18);
      }
      uVar2 = CONCAT13(local_93,(int3)uVar11);
      uVar11 = uVar2 & 0x1ffffff;
      bVar3 = twoSidedJacobiRotation<float>
                        ((Matrix44<float> *)(CONCAT44(iVar9,uVar2) & 0xffffffff01ffffff),
                         in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0,
                         (Matrix44<float> *)
                         CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                         in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
      local_94 = 1;
      if (!bVar3) {
        local_94 = (undefined1)(uVar11 >> 0x18);
      }
      uVar2 = CONCAT13(local_94,(int3)uVar11);
      uVar11 = uVar2 & 0x1ffffff;
      bVar3 = twoSidedJacobiRotation<float>
                        ((Matrix44<float> *)(CONCAT44(iVar9,uVar2) & 0xffffffff01ffffff),
                         in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0,
                         (Matrix44<float> *)
                         CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                         in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
      local_95 = 1;
      if (!bVar3) {
        local_95 = (undefined1)(uVar11 >> 0x18);
      }
      in_stack_ffffffffffffffc8 = CONCAT13(local_95,(int3)uVar11) & 0x1ffffff;
      if ((char)(in_stack_ffffffffffffffc8 >> 0x18) == '\0') break;
      fVar7 = maxOffDiag<float>((Matrix44<float> *)
                                CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
      local_96 = fVar6 < fVar7 && iVar9 < 0x14;
    } while (local_96);
  }
  pfVar4 = Matrix44<float>::operator[](in_RDI,0);
  in_RDX->x = *pfVar4;
  pfVar4 = Matrix44<float>::operator[](in_RDI,1);
  in_RDX->y = pfVar4[1];
  pfVar4 = Matrix44<float>::operator[](in_RDI,2);
  in_RDX->z = pfVar4[2];
  pfVar4 = Matrix44<float>::operator[](in_RDI,3);
  in_RDX->w = pfVar4[3];
  for (iVar9 = 0; iVar9 < 4; iVar9 = iVar9 + 1) {
    pfVar4 = Vec4<float>::operator[](in_RDX,iVar9);
    if (*pfVar4 <= 0.0 && *pfVar4 != 0.0) {
      pfVar4 = Vec4<float>::operator[](in_RDX,iVar9);
      fVar6 = *pfVar4;
      pfVar4 = Vec4<float>::operator[](in_RDX,iVar9);
      *pfVar4 = -fVar6;
      for (iVar8 = 0; iVar8 < 4; iVar8 = iVar8 + 1) {
        pfVar4 = Matrix44<float>::operator[](in_RSI,iVar8);
        fVar6 = pfVar4[iVar9];
        pfVar4 = Matrix44<float>::operator[](in_RSI,iVar8);
        pfVar4[iVar9] = -fVar6;
      }
    }
  }
  iVar9 = 1;
  do {
    if (3 < iVar9) {
      if ((in_R8B & 1) != 0) {
        fVar6 = Matrix44<float>::determinant
                          ((Matrix44<float> *)
                           CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
        if (fVar6 < 0.0) {
          for (local_80 = 0; local_80 < 4; local_80 = local_80 + 1) {
            pfVar4 = Matrix44<float>::operator[](in_RSI,local_80);
            fVar6 = pfVar4[3];
            pfVar4 = Matrix44<float>::operator[](in_RSI,local_80);
            pfVar4[3] = -fVar6;
          }
          in_RDX->w = -in_RDX->w;
        }
        fVar6 = Matrix44<float>::determinant
                          ((Matrix44<float> *)
                           CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
        if (fVar6 < 0.0) {
          for (local_84 = 0; local_84 < 4; local_84 = local_84 + 1) {
            pfVar4 = Matrix44<float>::operator[](in_RCX,local_84);
            fVar6 = -pfVar4[3];
            pfVar4 = Matrix44<float>::operator[](in_RCX,local_84);
            pfVar4[3] = fVar6;
          }
          in_RDX->w = -in_RDX->w;
        }
      }
      return;
    }
    pfVar4 = Matrix44<float>::operator[](in_RSI,0);
    fVar6 = pfVar4[iVar9];
    pfVar4 = Matrix44<float>::operator[](in_RSI,1);
    fVar7 = pfVar4[iVar9];
    pfVar4 = Matrix44<float>::operator[](in_RSI,2);
    fVar1 = pfVar4[iVar9];
    pfVar4 = Matrix44<float>::operator[](in_RSI,3);
    Vec4<float>::Vec4((Vec4<float> *)&stack0xffffffffffffffac,fVar6,fVar7,fVar1,pfVar4[iVar9]);
    pfVar4 = Matrix44<float>::operator[](in_RCX,0);
    fVar6 = pfVar4[iVar9];
    pfVar4 = Matrix44<float>::operator[](in_RCX,1);
    fVar7 = pfVar4[iVar9];
    pfVar4 = Matrix44<float>::operator[](in_RCX,2);
    fVar1 = pfVar4[iVar9];
    pfVar4 = Matrix44<float>::operator[](in_RCX,3);
    Vec4<float>::Vec4(&local_64,fVar6,fVar7,fVar1,pfVar4[iVar9]);
    pfVar4 = Vec4<float>::operator[](in_RDX,iVar9);
    fVar6 = *pfVar4;
    local_6c = iVar9 + -1;
    do {
      pVVar5 = in_RDX;
      Vec4<float>::operator[](in_RDX,local_6c);
      iVar8 = (int)pVVar5;
      std::abs(iVar8);
      in_stack_ffffffffffffff44 = extraout_XMM0_Da;
      std::abs(iVar8);
      if (extraout_XMM0_Da_00 <= in_stack_ffffffffffffff44) break;
      for (local_70 = 0; local_70 < 4; local_70 = local_70 + 1) {
        pfVar4 = Matrix44<float>::operator[](in_RSI,local_70);
        in_stack_ffffffffffffff40 = pfVar4[local_6c];
        pfVar4 = Matrix44<float>::operator[](in_RSI,local_70);
        pfVar4[local_6c + 1] = in_stack_ffffffffffffff40;
      }
      for (local_74 = 0; local_74 < 4; local_74 = local_74 + 1) {
        pfVar4 = Matrix44<float>::operator[](in_RCX,local_74);
        fVar7 = pfVar4[local_6c];
        pfVar4 = Matrix44<float>::operator[](in_RCX,local_74);
        pfVar4[local_6c + 1] = fVar7;
      }
      pfVar4 = Vec4<float>::operator[](in_RDX,local_6c);
      fVar7 = *pfVar4;
      pfVar4 = Vec4<float>::operator[](in_RDX,local_6c + 1);
      *pfVar4 = fVar7;
      local_6c = local_6c + -1;
    } while (-1 < local_6c);
    for (local_78 = 0; local_78 < 4; local_78 = local_78 + 1) {
      pfVar4 = Vec4<float>::operator[]((Vec4<float> *)&stack0xffffffffffffffac,local_78);
      fVar7 = *pfVar4;
      pfVar4 = Matrix44<float>::operator[](in_RSI,local_78);
      pfVar4[local_6c + 1] = fVar7;
    }
    for (local_7c = 0; local_7c < 4; local_7c = local_7c + 1) {
      pfVar4 = Vec4<float>::operator[](&local_64,local_7c);
      fVar7 = *pfVar4;
      pfVar4 = Matrix44<float>::operator[](in_RCX,local_7c);
      pfVar4[local_6c + 1] = fVar7;
    }
    pfVar4 = Vec4<float>::operator[](in_RDX,local_6c + 1);
    *pfVar4 = fVar6;
    iVar9 = iVar9 + 1;
  } while( true );
}

Assistant:

void
twoSidedJacobiSVD (
    IMATH_INTERNAL_NAMESPACE::Matrix44<T>  A,
    IMATH_INTERNAL_NAMESPACE::Matrix44<T>& U,
    IMATH_INTERNAL_NAMESPACE::Vec4<T>&     S,
    IMATH_INTERNAL_NAMESPACE::Matrix44<T>& V,
    const T                                tol,
    const bool                             forcePositiveDeterminant)
{
    // Please see the Matrix33 version for a detailed description of the algorithm.
    U.makeIdentity ();
    V.makeIdentity ();

    const int maxIter =
        20; // In case we get really unlucky, prevents infinite loops
    const T absTol =
        tol * maxOffDiag (A); // Tolerance is in terms of the maximum
    if (absTol != 0)          // _off-diagonal_ entry.
    {
        int numIter = 0;
        do
        {
            ++numIter;
            bool changed = twoSidedJacobiRotation (A, 0, 1, U, V, tol);
            changed = twoSidedJacobiRotation (A, 0, 2, U, V, tol) || changed;
            changed = twoSidedJacobiRotation (A, 0, 3, U, V, tol) || changed;
            changed = twoSidedJacobiRotation (A, 1, 2, U, V, tol) || changed;
            changed = twoSidedJacobiRotation (A, 1, 3, U, V, tol) || changed;
            changed = twoSidedJacobiRotation (A, 2, 3, U, V, tol) || changed;
            if (!changed) break;
        } while (maxOffDiag (A) > absTol && numIter < maxIter);
    }

    // The off-diagonal entries are (effectively) 0, so whatever's left on the
    // diagonal are the singular values:
    S.x = A[0][0];
    S.y = A[1][1];
    S.z = A[2][2];
    S.w = A[3][3];

    // Nothing thus far has guaranteed that the singular values are positive,
    // so let's go back through and flip them if not (since by contract we are
    // supposed to return all positive SVs):
    for (int i = 0; i < 4; ++i)
    {
        if (S[i] < 0)
        {
            // If we flip S[i], we need to flip the corresponding column of U
            // (we could also pick V if we wanted; it doesn't really matter):
            S[i] = -S[i];
            for (int j = 0; j < 4; ++j)
                U[j][i] = -U[j][i];
        }
    }

    // Order the singular values from largest to smallest using insertion sort:
    for (int i = 1; i < 4; ++i)
    {
        const IMATH_INTERNAL_NAMESPACE::Vec4<T> uCol (
            U[0][i], U[1][i], U[2][i], U[3][i]);
        const IMATH_INTERNAL_NAMESPACE::Vec4<T> vCol (
            V[0][i], V[1][i], V[2][i], V[3][i]);
        const T sVal = S[i];

        int j = i - 1;
        while (std::abs (S[j]) < std::abs (sVal))
        {
            for (int k = 0; k < 4; ++k)
                U[k][j + 1] = U[k][j];
            for (int k = 0; k < 4; ++k)
                V[k][j + 1] = V[k][j];
            S[j + 1] = S[j];

            --j;
            if (j < 0) break;
        }

        for (int k = 0; k < 4; ++k)
            U[k][j + 1] = uCol[k];
        for (int k = 0; k < 4; ++k)
            V[k][j + 1] = vCol[k];
        S[j + 1] = sVal;
    }

    if (forcePositiveDeterminant)
    {
        // We want to guarantee that the returned matrices always have positive
        // determinant.  We can do this by adding the appropriate number of
        // matrices of the form:
        //       [ 1          ]
        //  L =  [    1       ]
        //       [       1    ]
        //       [         -1 ]
        // Note that L' = L and L*L = Identity.  Thus we can add:
        //   U*L*L*S*V = (U*L)*(L*S)*V
        // if U has a negative determinant, and
        //   U*S*L*L*V = U*(S*L)*(L*V)
        // if V has a neg. determinant.
        if (U.determinant () < 0)
        {
            for (int i = 0; i < 4; ++i)
                U[i][3] = -U[i][3];
            S.w = -S.w;
        }

        if (V.determinant () < 0)
        {
            for (int i = 0; i < 4; ++i)
                V[i][3] = -V[i][3];
            S.w = -S.w;
        }
    }
}